

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

SPxLPBase<double> * __thiscall
soplex::SPxLPBase<double>::operator=(SPxLPBase<double> *this,SPxLPBase<double> *old)

{
  SPxOut *pSVar1;
  
  if (this != old) {
    LPRowSetBase<double>::operator=
              (&this->super_LPRowSetBase<double>,&old->super_LPRowSetBase<double>);
    LPColSetBase<double>::operator=
              (&this->super_LPColSetBase<double>,&old->super_LPColSetBase<double>);
    this->thesense = old->thesense;
    this->offset = old->offset;
    this->_isScaled = old->_isScaled;
    pSVar1 = old->spxout;
    this->lp_scaler = old->lp_scaler;
    this->spxout = pSVar1;
    (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (old->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(old->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return this;
}

Assistant:

SPxLPBase<R>& operator=(const SPxLPBase<R>& old)
   {
      if(this != &old)
      {
         LPRowSetBase<R>::operator=(old);
         LPColSetBase<R>::operator=(old);
         thesense = old.thesense;
         offset = old.offset;
         _isScaled = old._isScaled;
         lp_scaler = old.lp_scaler;
         spxout = old.spxout;
         _tolerances = old._tolerances;

         assert(isConsistent());
      }

      return *this;
   }